

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.cc
# Opt level: O0

int unzip(string *path)

{
  ifstream *piVar1;
  ostream *this;
  Zip *this_00;
  size_t in_RCX;
  void *__buf;
  undefined8 in_RDI;
  vector<char,_std::allocator<char>_> data;
  ofstream of;
  Zip zip;
  Zip *in_stack_fffffffffffffca8;
  vector<char,_std::allocator<char>_> *this_01;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  vector<char,_std::allocator<char>_> *this_02;
  undefined1 local_328 [56];
  char local_2f0 [512];
  string local_f0 [48];
  vector<char,_std::allocator<char>_> local_c0 [7];
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  Zip *in_stack_fffffffffffffff0;
  
  piVar1 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(piVar1,in_RDI,8);
  this_02 = local_c0;
  std::unique_ptr<std::istream,std::default_delete<std::istream>>::
  unique_ptr<std::default_delete<std::istream>,void>
            (in_stack_fffffffffffffcb0,(pointer)in_stack_fffffffffffffca8);
  Zip::Zip(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(in_stack_fffffffffffffcb0);
  Zip::fileName_abi_cxx11_(in_stack_fffffffffffffca8);
  this = std::operator<<((ostream *)&std::cout,local_f0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_f0);
  Zip::fileName_abi_cxx11_(in_stack_fffffffffffffca8);
  std::ofstream::ofstream(local_2f0,local_328 + 0x18,0x10);
  std::__cxx11::string::~string((string *)(local_328 + 0x18));
  Zip::read((Zip *)local_328,(int)local_c0 + 8,__buf,in_RCX);
  this_01 = (vector<char,_std::allocator<char>_> *)local_328;
  this_00 = (Zip *)std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x10563a);
  std::vector<char,_std::allocator<char>_>::size(this_01);
  std::ostream::write(local_2f0,(long)this_00);
  std::vector<char,_std::allocator<char>_>::~vector(this_02);
  std::ofstream::~ofstream(local_2f0);
  Zip::~Zip(this_00);
  return 0;
}

Assistant:

int unzip(std::string path) {
  Zip zip(std::unique_ptr<std::istream>(new std::ifstream(path)));
  std::cout << zip.fileName() << std::endl;
  std::ofstream of(zip.fileName());
  auto data = zip.read();
  of.write(data.data(), data.size());
  return 0;
}